

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_hist(spng_ctx *ctx,spng_hist *hist)

{
  int ret;
  spng_hist *hist_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (hist == (spng_hist *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      if (((uint)ctx->stored >> 1 & 1) == 0) {
        ctx_local._4_4_ = 0x36;
      }
      else {
        memcpy(&ctx->hist,hist,0x200);
        ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xfffffdff | 0x200);
        ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xfffffdff | 0x200);
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_hist(spng_ctx *ctx, struct spng_hist *hist)
{
    SPNG_SET_CHUNK_BOILERPLATE(hist);

    if(!ctx->stored.plte) return SPNG_EHIST_NO_PLTE;

    ctx->hist = *hist;

    ctx->stored.hist = 1;
    ctx->user.hist = 1;

    return 0;
}